

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O0

void Aig_ManChoiceLevel_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  Tim_Man_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  int local_34;
  int LevelMax;
  int nTerms;
  int iTerm1;
  int iBox;
  int i;
  Aig_Obj_t *pNext;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  local_34 = 0;
  iVar1 = Aig_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Aig_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Aig_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsCo(pObj);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjIsNode(pObj);
        if (iVar1 == 0) {
          iVar1 = Aig_ObjIsConst1(pObj);
          if (iVar1 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                          ,0x236,"void Aig_ManChoiceLevel_rec(Aig_Man_t *, Aig_Obj_t *)");
          }
        }
        else {
          pAVar4 = Aig_ObjFanin0(pObj);
          Aig_ManChoiceLevel_rec(p,pAVar4);
          iVar1 = Aig_ObjLevel(pAVar4);
          if (0 < iVar1) {
            local_34 = Aig_ObjLevel(pAVar4);
          }
          pAVar4 = Aig_ObjFanin1(pObj);
          Aig_ManChoiceLevel_rec(p,pAVar4);
          iVar1 = Aig_ObjLevel(pAVar4);
          if (local_34 < iVar1) {
            local_34 = Aig_ObjLevel(pAVar4);
          }
          local_34 = local_34 + 1;
          if ((p->pEquivs != (Aig_Obj_t **)0x0) &&
             (pAVar4 = Aig_ObjEquiv(p,pObj), pAVar4 != (Aig_Obj_t *)0x0)) {
            Aig_ManChoiceLevel_rec(p,pAVar4);
            iVar1 = Aig_ObjLevel(pAVar4);
            if (local_34 < iVar1) {
              local_34 = Aig_ObjLevel(pAVar4);
            }
          }
        }
      }
      else {
        pAVar4 = Aig_ObjFanin0(pObj);
        Aig_ManChoiceLevel_rec(p,pAVar4);
        iVar1 = Aig_ObjLevel(pAVar4);
        if (0 < iVar1) {
          local_34 = Aig_ObjLevel(pAVar4);
        }
      }
    }
    else if (p->pManTime != (void *)0x0) {
      p_00 = (Tim_Man_t *)p->pManTime;
      iVar1 = Aig_ObjCioId(pObj);
      iVar1 = Tim_ManBoxForCi(p_00,iVar1);
      if (-1 < iVar1) {
        iVar2 = Tim_ManBoxInputFirst((Tim_Man_t *)p->pManTime,iVar1);
        iVar1 = Tim_ManBoxInputNum((Tim_Man_t *)p->pManTime,iVar1);
        for (iTerm1 = 0; iTerm1 < iVar1; iTerm1 = iTerm1 + 1) {
          pAVar4 = Aig_ManCo(p,iVar2 + iTerm1);
          Aig_ManChoiceLevel_rec(p,pAVar4);
          iVar3 = Aig_ObjLevel(pAVar4);
          if (local_34 < iVar3) {
            local_34 = Aig_ObjLevel(pAVar4);
          }
        }
        local_34 = local_34 + 1;
      }
    }
    Aig_ObjSetLevel(pObj,local_34);
  }
  return;
}

Assistant:

void Aig_ManChoiceLevel_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pNext;
    int i, iBox, iTerm1, nTerms, LevelMax = 0;
    if ( Aig_ObjIsTravIdCurrent( p, pObj ) )
        return;
    Aig_ObjSetTravIdCurrent( p, pObj );
    if ( Aig_ObjIsCi(pObj) )
    {
        if ( p->pManTime )
        {
            iBox = Tim_ManBoxForCi( (Tim_Man_t *)p->pManTime, Aig_ObjCioId(pObj) );
            if ( iBox >= 0 ) // this is not a true PI
            {
                iTerm1 = Tim_ManBoxInputFirst( (Tim_Man_t *)p->pManTime, iBox );
                nTerms = Tim_ManBoxInputNum( (Tim_Man_t *)p->pManTime, iBox );
                for ( i = 0; i < nTerms; i++ )
                {
                    pNext = Aig_ManCo(p, iTerm1 + i);
                    Aig_ManChoiceLevel_rec( p, pNext );
                    if ( LevelMax < Aig_ObjLevel(pNext) )
                        LevelMax = Aig_ObjLevel(pNext);
                }
                LevelMax++;
            }
        }
//        printf( "%d ", pObj->Level );
    }
    else if ( Aig_ObjIsCo(pObj) )
    {
        pNext = Aig_ObjFanin0(pObj);
        Aig_ManChoiceLevel_rec( p, pNext );
        if ( LevelMax < Aig_ObjLevel(pNext) )
            LevelMax = Aig_ObjLevel(pNext);
    }
    else if ( Aig_ObjIsNode(pObj) )
    { 
        // get the maximum level of the two fanins
        pNext = Aig_ObjFanin0(pObj);
        Aig_ManChoiceLevel_rec( p, pNext );
        if ( LevelMax < Aig_ObjLevel(pNext) )
            LevelMax = Aig_ObjLevel(pNext);
        pNext = Aig_ObjFanin1(pObj);
        Aig_ManChoiceLevel_rec( p, pNext );
        if ( LevelMax < Aig_ObjLevel(pNext) )
            LevelMax = Aig_ObjLevel(pNext);
        LevelMax++;

        // get the level of the nodes in the choice node
        if ( p->pEquivs && (pNext = Aig_ObjEquiv(p, pObj)) )
        {
            Aig_ManChoiceLevel_rec( p, pNext );
            if ( LevelMax < Aig_ObjLevel(pNext) )
                LevelMax = Aig_ObjLevel(pNext);
        }
    }
    else if ( !Aig_ObjIsConst1(pObj) )
        assert( 0 );
    Aig_ObjSetLevel( pObj, LevelMax );
}